

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::local_date(spec *s)

{
  sequence *in_RDI;
  spec *in_stack_ffffffffffffff08;
  char_type c;
  digit *in_stack_ffffffffffffff10;
  repeat_exact *this;
  repeat_exact *args_4;
  repeat_exact *in_stack_ffffffffffffff30;
  repeat_exact *in_stack_ffffffffffffff38;
  character *in_stack_ffffffffffffff40;
  repeat_exact *in_stack_ffffffffffffff48;
  sequence *in_stack_ffffffffffffff50;
  repeat_exact local_90 [3];
  repeat_exact local_40 [2];
  
  args_4 = local_40;
  digit::digit(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            (in_stack_ffffffffffffff30,(size_t)args_4,(digit *)in_RDI);
  character::character
            ((character *)in_stack_ffffffffffffff10,
             (char_type)((ulong)in_stack_ffffffffffffff08 >> 0x38));
  this = local_90;
  digit::digit((digit *)this,in_stack_ffffffffffffff08);
  c = (char_type)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            (in_stack_ffffffffffffff30,(size_t)args_4,(digit *)in_RDI);
  character::character((character *)this,c);
  digit::digit((digit *)this,(spec *)&stack0xffffffffffffff30);
  repeat_exact::repeat_exact<toml::detail::syntax::digit>
            (in_stack_ffffffffffffff30,(size_t)args_4,(digit *)in_RDI);
  sequence::
  sequence<toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact,toml::detail::character,toml::detail::repeat_exact>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,(character *)in_stack_ffffffffffffff30,args_4);
  repeat_exact::~repeat_exact(this);
  digit::~digit((digit *)this);
  character::~character((character *)0x7533bf);
  repeat_exact::~repeat_exact(this);
  digit::~digit((digit *)this);
  character::~character((character *)0x7533e3);
  repeat_exact::~repeat_exact(this);
  digit::~digit((digit *)this);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence local_date(const spec& s)
{
    return sequence(
            repeat_exact(4, digit(s)),
            character('-'),
            repeat_exact(2, digit(s)),
            character('-'),
            repeat_exact(2, digit(s))
        );
}